

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_date_scanfn(arg_date *parent,char *argval)

{
  int iVar1;
  tm *ptVar2;
  tm *ptVar3;
  int iVar4;
  char *pcVar5;
  tm tm;
  tm local_48;
  
  iVar1 = parent->count;
  iVar4 = 2;
  if (iVar1 != (parent->hdr).maxcount) {
    if (argval == (char *)0x0) {
      parent->count = iVar1 + 1;
    }
    else {
      ptVar2 = parent->tmval;
      local_48.tm_zone = ptVar2[iVar1].tm_zone;
      ptVar3 = ptVar2 + iVar1;
      local_48.tm_sec = ptVar3->tm_sec;
      local_48.tm_min = ptVar3->tm_min;
      local_48.tm_hour = ptVar3->tm_hour;
      local_48.tm_mday = ptVar3->tm_mday;
      ptVar3 = ptVar2 + iVar1;
      local_48.tm_mon = ptVar3->tm_mon;
      local_48.tm_year = ptVar3->tm_year;
      local_48._24_8_ = *(undefined8 *)(&ptVar3->tm_mon + 2);
      ptVar2 = ptVar2 + iVar1;
      local_48.tm_isdst = ptVar2->tm_isdst;
      local_48._36_4_ = *(undefined4 *)&ptVar2->field_0x24;
      local_48.tm_gmtoff = *(long *)(&ptVar2->tm_isdst + 2);
      pcVar5 = arg_strptime(argval,parent->format,&local_48);
      if (pcVar5 == (char *)0x0) {
        return 6;
      }
      if (*pcVar5 != '\0') {
        return 6;
      }
      ptVar3 = parent->tmval;
      iVar1 = parent->count;
      parent->count = iVar1 + 1;
      ptVar3[iVar1].tm_zone = local_48.tm_zone;
      ptVar2 = ptVar3 + iVar1;
      ptVar2->tm_isdst = local_48.tm_isdst;
      *(undefined4 *)&ptVar2->field_0x24 = local_48._36_4_;
      *(long *)(&ptVar2->tm_isdst + 2) = local_48.tm_gmtoff;
      ptVar2 = ptVar3 + iVar1;
      ptVar2->tm_mon = local_48.tm_mon;
      ptVar2->tm_year = local_48.tm_year;
      *(undefined8 *)(&ptVar2->tm_mon + 2) = local_48._24_8_;
      ptVar3 = ptVar3 + iVar1;
      ptVar3->tm_sec = local_48.tm_sec;
      ptVar3->tm_min = local_48.tm_min;
      ptVar3->tm_hour = local_48.tm_hour;
      ptVar3->tm_mday = local_48.tm_mday;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int arg_date_scanfn(struct arg_date * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* no argument value was given, leave parent->tmval[] unaltered but still count it */
		parent->count++;
	} else {
		const char * pend;
		struct tm tm = parent->tmval[parent->count];

		/* parse the given argument value, store result in parent->tmval[] */
		pend = arg_strptime(argval, parent->format, &tm);

		if (pend && pend[0] == '\0') {
			parent->tmval[parent->count++] = tm;
		} else {
			errorcode = EBADDATE;
		}
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}